

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandMvsis(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  char *pcVar2;
  Abc_Ntk_t *pAVar3;
  FILE *__stream_00;
  int local_4d4;
  char *pcStack_4d0;
  int i;
  char *pMvsisName;
  char *pNameUnix;
  char *pNameWin;
  char Buffer [100];
  char local_448 [8];
  char Command [1000];
  Abc_Ntk_t *pNetlist;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  FILE *pOut;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNameUnix = "mvsis.exe";
  pMvsisName = "mvsis";
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  if (((argc != 1) && (iVar1 = strcmp(argv[1],"-h"), iVar1 != 0)) &&
     (iVar1 = strcmp(argv[1],"-?"), iVar1 != 0)) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      fprintf(__stream,"Empty network.\n");
    }
    else {
      iVar1 = strcmp(*argv,"mvsis");
      if (iVar1 == 0) {
        pcVar2 = Cmd_FlagReadByName(pAbc,"mvsiswin");
        if (pcVar2 != (char *)0x0) {
          pNameUnix = Cmd_FlagReadByName(pAbc,"mvsiswin");
        }
        pcVar2 = Cmd_FlagReadByName(pAbc,"mvsisunix");
        if (pcVar2 != (char *)0x0) {
          pMvsisName = Cmd_FlagReadByName(pAbc,"mvsisunix");
        }
        pOut = (FILE *)fopen(pNameUnix,"r");
        if ((FILE *)pOut == (FILE *)0x0) {
          pOut = (FILE *)fopen(pMvsisName,"r");
          if ((FILE *)pOut == (FILE *)0x0) {
            fprintf(__stream,"Cannot find \"%s\" or \"%s\" in the current directory.\n",pNameUnix,
                    pMvsisName);
            goto LAB_003305d6;
          }
          pcStack_4d0 = pMvsisName;
        }
        else {
          pcStack_4d0 = pNameUnix;
        }
        fclose((FILE *)pOut);
        iVar1 = Abc_NtkIsMappedLogic(pNtk_00);
        if (iVar1 != 0) {
          Abc_NtkMapToSop(pNtk_00);
          printf("The current network is unmapped before calling MVSIS.\n");
        }
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 != 0) {
          Abc_NtkToSop(pNtk_00,-1,1000000000);
        }
        pAVar3 = Abc_NtkToNetlist(pNtk_00);
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          fprintf(__stream,"Cannot produce the intermediate network.\n");
        }
        else {
          Io_WriteBlif(pAVar3,"_mvsis_in.blif",1,0,0);
          Abc_NtkDelete(pAVar3);
          sprintf(local_448,"%s -x -c ",pcStack_4d0);
          strcat(local_448,"\"");
          strcat(local_448,"read_blif _mvsis_in.blif");
          strcat(local_448,"; ");
          for (local_4d4 = 1; local_4d4 < argc; local_4d4 = local_4d4 + 1) {
            sprintf((char *)&pNameWin," %s",argv[local_4d4]);
            strcat(local_448,(char *)&pNameWin);
          }
          strcat(local_448,"; ");
          strcat(local_448,"write_blif _mvsis_out.blif");
          strcat(local_448,"\"");
          iVar1 = Util_SignalSystem(local_448);
          if (iVar1 == 0) {
            __stream_00 = fopen("_mvsis_out.blif","r");
            if (__stream_00 != (FILE *)0x0) {
              fclose(__stream_00);
              pAVar3 = Io_Read("_mvsis_out.blif",IO_FILE_BLIF,1,0);
              if (pNtk_00->pSpec != (char *)0x0) {
                if (pAVar3->pSpec != (char *)0x0) {
                  free(pAVar3->pSpec);
                  pAVar3->pSpec = (char *)0x0;
                }
                pcVar2 = Extra_UtilStrsav(pNtk_00->pSpec);
                pAVar3->pSpec = pcVar2;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
              unlink("_mvsis_in.blif");
              unlink("_mvsis_out.blif");
              return 0;
            }
            fprintf(__stream,"Cannot open MVSIS output file \"%s\".\n","_mvsis_out.blif");
            unlink("_mvsis_in.blif");
          }
          else {
            fprintf(__stream,"The following command has returned non-zero exit status:\n");
            fprintf(__stream,"\"%s\"\n",local_448);
            unlink("_mvsis_in.blif");
          }
        }
      }
      else {
        fprintf(__stream,"Wrong command: \"%s\".\n",*argv);
      }
    }
  }
LAB_003305d6:
  fprintf(__stream,"Usage: mvsis [-h] <com>\n");
  fprintf(__stream,"         invokes MVSIS command for the current ABC network\n");
  fprintf(__stream,"         (the executable of MVSIS should be in the same directory)\n");
  fprintf(__stream,"   -h  : print the command usage\n");
  fprintf(__stream,
          " <com> : a MVSIS command (or a semicolon-separated list of commands in quotes)\n");
  fprintf(__stream,"         Example 1: mvsis fraig_sweep\n");
  fprintf(__stream,"         Example 2: mvsis \"ps; fxu; ps\"\n");
  fprintf(__stream,"         Example 3: mvsis source mvsis.rugged\n");
  return 1;
}

Assistant:

int CmdCommandMvsis( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkNew, * pNetlist;
    char Command[1000], Buffer[100];
    char * pNameWin = "mvsis.exe";
    char * pNameUnix = "mvsis";
    char * pMvsisName;
    int i;

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( argc == 1 )
        goto usage;
    if ( strcmp( argv[1], "-h" ) == 0 )
        goto usage;
    if ( strcmp( argv[1], "-?" ) == 0 )
        goto usage;

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        goto usage;
    }

    if ( strcmp( argv[0], "mvsis" ) != 0 )
    {
        fprintf( pErr, "Wrong command: \"%s\".\n", argv[0] );
        goto usage;
    }

    // get the names from the resource file
    if ( Cmd_FlagReadByName(pAbc, "mvsiswin") )
        pNameWin = Cmd_FlagReadByName(pAbc, "mvsiswin");
    if ( Cmd_FlagReadByName(pAbc, "mvsisunix") )
        pNameUnix = Cmd_FlagReadByName(pAbc, "mvsisunix");

    // check if MVSIS is available
    if ( (pFile = fopen( pNameWin, "r" )) )
        pMvsisName = pNameWin;
    else if ( (pFile = fopen( pNameUnix, "r" )) )
        pMvsisName = pNameUnix;
    else if ( pFile == NULL )
    {
        fprintf( pErr, "Cannot find \"%s\" or \"%s\" in the current directory.\n", pNameWin, pNameUnix );
        goto usage;
    }
    fclose( pFile );

    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        printf( "The current network is unmapped before calling MVSIS.\n" );
    }

    // write out the current network
    if ( Abc_NtkIsLogic(pNtk) )
        Abc_NtkToSop(pNtk, -1, ABC_INFINITY);
    pNetlist = Abc_NtkToNetlist(pNtk);
    if ( pNetlist == NULL )
    {
        fprintf( pErr, "Cannot produce the intermediate network.\n" );
        goto usage;
    }
    Io_WriteBlif( pNetlist, "_mvsis_in.blif", 1, 0, 0 );
    Abc_NtkDelete( pNetlist );

    // create the file for MVSIS
    sprintf( Command, "%s -x -c ", pMvsisName );
    strcat ( Command, "\"" );
    strcat ( Command, "read_blif _mvsis_in.blif" );
    strcat ( Command, "; " );
    for ( i = 1; i < argc; i++ )
    {
        sprintf( Buffer, " %s", argv[i] );
        strcat( Command, Buffer );
    }
    strcat( Command, "; " );
    strcat( Command, "write_blif _mvsis_out.blif" );
    strcat( Command, "\"" );

    // call MVSIS
    if ( Util_SignalSystem( Command ) )
    {
        fprintf( pErr, "The following command has returned non-zero exit status:\n" );
        fprintf( pErr, "\"%s\"\n", Command );
        unlink( "_mvsis_in.blif" );
        goto usage;
    }

    // read in the MVSIS output
    if ( (pFile = fopen( "_mvsis_out.blif", "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open MVSIS output file \"%s\".\n", "_mvsis_out.blif" );
        unlink( "_mvsis_in.blif" );
        goto usage;
    }
    fclose( pFile );

    // set the new network
    pNtkNew = Io_Read( "_mvsis_out.blif", IO_FILE_BLIF, 1, 0 );
    // set the original spec of the new network
    if ( pNtk->pSpec )
    {
        ABC_FREE( pNtkNew->pSpec );
        pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );

    // remove temporary networks
    unlink( "_mvsis_in.blif" );
    unlink( "_mvsis_out.blif" );
    return 0;

usage:
    fprintf( pErr, "Usage: mvsis [-h] <com>\n");
    fprintf( pErr, "         invokes MVSIS command for the current ABC network\n" );
    fprintf( pErr, "         (the executable of MVSIS should be in the same directory)\n" );
    fprintf( pErr, "   -h  : print the command usage\n" );
    fprintf( pErr, " <com> : a MVSIS command (or a semicolon-separated list of commands in quotes)\n" );
    fprintf( pErr, "         Example 1: mvsis fraig_sweep\n" );
    fprintf( pErr, "         Example 2: mvsis \"ps; fxu; ps\"\n" );
    fprintf( pErr, "         Example 3: mvsis source mvsis.rugged\n" );
    return 1;                   // error exit
}